

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O1

ostream * __thiscall smf::Option_register::print(Option_register *this,ostream *out)

{
  ostream *poVar1;
  char local_19;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"definition:\t",0xc);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(this->definition)._M_dataplus._M_p,(this->definition)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"description:\t",0xd);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(this->description)._M_dataplus._M_p,(this->description)._M_string_length)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"defaultOption:\t",0xf);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(this->defaultOption)._M_dataplus._M_p,
                      (this->defaultOption)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"modifiedOption:\t",0x10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(this->modifiedOption)._M_dataplus._M_p,
                      (this->modifiedOption)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"modifiedQ:\t\t",0xc);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(out,0));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"type:\t\t",7);
  local_19 = this->type;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(out,&local_19,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return out;
}

Assistant:

std::ostream& Option_register::print(std::ostream& out) {
   out << "definition:\t"     << definition     << std::endl;
   out << "description:\t"    << description    << std::endl;
   out << "defaultOption:\t"  << defaultOption  << std::endl;
   out << "modifiedOption:\t" << modifiedOption << std::endl;
   out << "modifiedQ:\t\t"    << modifiedQ      << std::endl;
   out << "type:\t\t"         << type           << std::endl;
   return out;
}